

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Float32_To_Int32(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                     int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float *src;
  PaInt32 *dest;
  
  if (count != 0) {
    do {
      *(int *)destinationBuffer = (int)(*sourceBuffer * 2.1474836e+09);
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Float32_To_Int32(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    PaInt32 *dest =  (PaInt32*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        /* REVIEW */
#ifdef PA_USE_C99_LRINTF
        float scaled = *src * 0x7FFFFFFF;
        *dest = lrintf(scaled-0.5f);
#else
        double scaled = *src * 0x7FFFFFFF;
        *dest = (PaInt32) scaled;        
#endif
        
        src += sourceStride;
        dest += destinationStride;
    }
}